

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iso_writer.cpp
# Opt level: O0

int __thiscall
IsoWriter::writeExtendedFileEntryDescriptor
          (IsoWriter *this,bool namedStream,uint8_t objectId,FileTypes fileType,uint64_t len,
          uint32_t pos,uint16_t linkCount,ExtentList *extents)

{
  int64_t iVar1;
  int iVar2;
  uint32_t tagLocation;
  int32_t iVar3;
  uint64_t uVar4;
  char *__src;
  size_type sVar5;
  const_reference pvVar6;
  uint8_t *puVar7;
  uint8_t *puVar8;
  size_t sVar9;
  uint8_t *local_c0;
  uint8_t *local_88;
  size_t indexStart;
  size_t i;
  uint8_t *curPos;
  size_t indexEnd;
  uint8_t *local_40;
  uint64_t *buff64;
  uint16_t *buff16;
  uint32_t *buff32;
  int sectorsWrited;
  uint32_t pos_local;
  uint64_t len_local;
  FileTypes fileType_local;
  uint8_t objectId_local;
  bool namedStream_local;
  IsoWriter *this_local;
  
  buff32._0_4_ = 0;
  buff32._4_4_ = pos;
  _sectorsWrited = len;
  len_local._0_4_ = fileType;
  len_local._6_1_ = objectId;
  len_local._7_1_ = namedStream;
  _fileType_local = this;
  memset(this->m_buffer,0,0x800);
  tagLocation = absoluteSectorNum(this);
  anon_unknown.dwarf_b4dde::writeDescriptorTag(this->m_buffer,ExtendedFileEntry,tagLocation);
  buff16 = (uint16_t *)this->m_buffer;
  buff64 = (uint64_t *)this->m_buffer;
  local_40 = this->m_buffer;
  writeIcbTag((bool)(len_local._7_1_ & 1),this->m_buffer + 0x10,(FileTypes)len_local);
  buff16[0x12] = 0xffff;
  buff16[0x13] = 0xffff;
  buff16[0x14] = 0xffff;
  buff16[0x15] = 0xffff;
  if ((int)(FileTypes)len_local < 0xfa) {
    if (((FileTypes)len_local == File) || ((FileTypes)len_local == RealtimeFile)) {
      buff16[0x16] = 0x1084;
      buff16[0x17] = 0;
      if (linkCount != 1) {
        __assert_fail("linkCount == 1",
                      "/workspace/llm4binary/github/license_c_cmakelists/justdan96[P]tsMuxer/tsMuxer/iso_writer.cpp"
                      ,0x3fe,
                      "int IsoWriter::writeExtendedFileEntryDescriptor(const bool, const uint8_t, const FileTypes, const uint64_t, const uint32_t, const uint16_t, const ExtentList *)"
                     );
      }
      *(undefined2 *)(buff64 + 6) = 1;
    }
    else {
      buff16[0x16] = 0x14a5;
      buff16[0x17] = 0;
      *(uint16_t *)(buff64 + 6) = linkCount;
    }
  }
  else {
    buff16[0x16] = 0;
    buff16[0x17] = 0;
    if (linkCount != 0) {
      __assert_fail("linkCount == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/justdan96[P]tsMuxer/tsMuxer/iso_writer.cpp"
                    ,0x3f8,
                    "int IsoWriter::writeExtendedFileEntryDescriptor(const bool, const uint8_t, const FileTypes, const uint64_t, const uint32_t, const uint16_t, const ExtentList *)"
                   );
    }
    *(undefined2 *)(buff64 + 6) = 0;
  }
  this->m_buffer[0x32] = '\0';
  this->m_buffer[0x33] = '\0';
  buff16[0x1a] = 0;
  buff16[0x1b] = 0;
  *(uint64_t *)(local_40 + 0x38) = _sectorsWrited;
  *(uint64_t *)(local_40 + 0x40) = _sectorsWrited;
  indexEnd = 0x800;
  uVar4 = roundUp64((uint64_t *)&sectorsWrited,&indexEnd);
  *(int *)(buff16 + 0x24) = (int)(uVar4 >> 0xb);
  buff16[0x26] = 0;
  buff16[0x27] = 0;
  anon_unknown.dwarf_b4dde::writeTimestamp(this->m_buffer + 0x50,this->m_currentTime);
  anon_unknown.dwarf_b4dde::writeTimestamp(this->m_buffer + 0x5c,this->m_currentTime);
  anon_unknown.dwarf_b4dde::writeTimestamp(this->m_buffer + 0x68,this->m_currentTime);
  anon_unknown.dwarf_b4dde::writeTimestamp(this->m_buffer + 0x74,this->m_currentTime);
  buff16[0x40] = 1;
  buff16[0x41] = 0;
  __src = (char *)std::__cxx11::string::c_str();
  strcpy((char *)(this->m_buffer + 0xa9),__src);
  this->m_buffer[200] = len_local._6_1_;
  iVar2 = (int)this;
  if (((FileTypes)len_local == File) || ((FileTypes)len_local == RealtimeFile)) {
    if (extents == (ExtentList *)0x0) {
      buff16[0x6a] = 0x10;
      buff16[0x6b] = 0;
      sVar9 = 0;
      anon_unknown.dwarf_b4dde::writeLongAD
                (this->m_buffer + 0xd8,(uint32_t)_sectorsWrited,buff32._4_4_,0,0);
      anon_unknown.dwarf_b4dde::calcDescriptorCRC(this->m_buffer,0xe8);
      File::write(&this->m_file,iVar2 + 0xa0,(void *)0x800,sVar9);
      buff32._0_4_ = (int)buff32 + 1;
    }
    else {
      sVar5 = std::vector<Extent,_std::allocator<Extent>_>::size(extents);
      if (sVar5 < 0x70) {
        local_88 = (uint8_t *)std::vector<Extent,_std::allocator<Extent>_>::size(extents);
      }
      else {
        local_88 = (uint8_t *)0x70;
      }
      curPos = local_88;
      sVar5 = std::vector<Extent,_std::allocator<Extent>_>::size(extents);
      if (sVar5 - (long)local_88 == 1) {
        curPos = local_88 + 1;
      }
      *(int *)(buff16 + 0x6a) = (int)((long)curPos << 4);
      i = (size_t)(this->m_buffer + 0xd8);
      for (indexStart = 0; indexStart < curPos; indexStart = indexStart + 1) {
        pvVar6 = std::vector<Extent,_std::allocator<Extent>_>::at(extents,indexStart);
        iVar1 = pvVar6->size;
        pvVar6 = std::vector<Extent,_std::allocator<Extent>_>::at(extents,indexStart);
        anon_unknown.dwarf_b4dde::writeLongAD((uint8_t *)i,(uint32_t)iVar1,pvVar6->lbnPos,0,0);
        i = i + 0x10;
      }
      puVar7 = (uint8_t *)std::vector<Extent,_std::allocator<Extent>_>::size(extents);
      if (curPos < puVar7) {
        *(int *)(buff16 + 0x6a) = *(int *)(buff16 + 0x6a) + 0x10;
        iVar3 = absoluteSectorNum(this);
        anon_unknown.dwarf_b4dde::writeLongAD((uint8_t *)i,0xc0000800,iVar3 + 1,1,0);
        i = i + 0x10;
      }
      puVar7 = this->m_buffer;
      anon_unknown.dwarf_b4dde::calcDescriptorCRC(this->m_buffer,(short)i - (short)puVar7);
      File::write(&this->m_file,iVar2 + 0xa0,(void *)0x800,(size_t)puVar7);
      while( true ) {
        puVar7 = curPos;
        buff32._0_4_ = (int)buff32 + 1;
        puVar8 = (uint8_t *)std::vector<Extent,_std::allocator<Extent>_>::size(extents);
        if (puVar8 <= curPos) break;
        puVar8 = (uint8_t *)std::vector<Extent,_std::allocator<Extent>_>::size(extents);
        if (puVar8 < curPos + 0x7c) {
          local_c0 = (uint8_t *)std::vector<Extent,_std::allocator<Extent>_>::size(extents);
        }
        else {
          local_c0 = curPos + 0x7c;
        }
        curPos = local_c0;
        sVar5 = std::vector<Extent,_std::allocator<Extent>_>::size(extents);
        if (sVar5 - (long)local_c0 == 1) {
          curPos = local_c0 + 1;
        }
        writeAllocationExtentDescriptor(this,extents,(size_t)puVar7,(size_t)curPos);
      }
    }
  }
  else {
    buff16[0x6a] = 8;
    buff16[0x6b] = 0;
    *(uint32_t *)(buff16 + 0x6c) = (uint32_t)_sectorsWrited;
    sVar9 = (size_t)buff32._4_4_;
    *(uint32_t *)(buff16 + 0x6e) = buff32._4_4_;
    anon_unknown.dwarf_b4dde::calcDescriptorCRC(this->m_buffer,0xe0);
    File::write(&this->m_file,iVar2 + 0xa0,(void *)0x800,sVar9);
    buff32._0_4_ = (int)buff32 + 1;
  }
  return (int)buff32;
}

Assistant:

int IsoWriter::writeExtendedFileEntryDescriptor(const bool namedStream, const uint8_t objectId,
                                                const FileTypes fileType, const uint64_t len, const uint32_t pos,
                                                const uint16_t linkCount, const ExtentList *extents)
{
    int sectorsWrited = 0;

    memset(m_buffer, 0, sizeof(m_buffer));
    writeDescriptorTag(m_buffer, DescriptorTag::ExtendedFileEntry, absoluteSectorNum());

    const auto buff32 = reinterpret_cast<uint32_t *>(m_buffer);
    const auto buff16 = reinterpret_cast<uint16_t *>(m_buffer);
    const auto buff64 = reinterpret_cast<uint64_t *>(m_buffer);

    writeIcbTag(namedStream, m_buffer + 16, fileType);

    buff32[36 / 4] = UINT_MAX;  // uid
    buff32[40 / 4] = UINT_MAX;  // guid
    // zero Permissions, File Link Count, Record Format, Record Display Attributes
    if (fileType >= FileTypes::Metadata)
    {
        buff32[44 / 4] = 0x000000;  // Permissions
        assert(linkCount == 0);
        buff16[48 / 2] = linkCount;  // File Link Count
    }
    else if (fileType == FileTypes::File || fileType == FileTypes::RealtimeFile)
    {
        buff32[44 / 4] = 0x1084;  // Permissions
        assert(linkCount == 1);
        buff16[48 / 2] = linkCount;  // File Link Count
    }
    else
    {
        buff32[44 / 4] = 0x14A5;     // Permissions
        buff16[48 / 2] = linkCount;  // File Link Count
    }

    m_buffer[50] = 0x0;  // Record Format
    m_buffer[51] = 0x0;  // Record Display Attributes

    buff32[52 / 4] = 0x00;  // Record Length
    buff64[56 / 8] = len;   // Information Length
    buff64[64 / 8] = len;   // Object Size

    buff32[72 / 4] =
        static_cast<uint32_t>(roundUp64(len, SECTOR_SIZE) / SECTOR_SIZE);  // blocks recorded (matched to bytes)
    buff32[76 / 4] = 0x00;                                                 // high part of blocks recorded

    writeTimestamp(m_buffer + 80, m_currentTime);   // access datetime
    writeTimestamp(m_buffer + 92, m_currentTime);   // modification datetime
    writeTimestamp(m_buffer + 104, m_currentTime);  // creation datetime
    writeTimestamp(m_buffer + 116, m_currentTime);  // attributes datetime
    buff32[128 / 4] = 0x01;                         // Checkpoint
    // skip Extended Attribute ICB
    // skip Stream Directory ICB

    strcpy(reinterpret_cast<char *>(m_buffer) + 169, m_impId.c_str());  // Implementation Identifier
    m_buffer[200] = objectId;                                           // Unique ID

    // skip Length of Extended Attributes
    if (fileType != FileTypes::File && fileType != FileTypes::RealtimeFile)
    {
        // metadata object (metadata file, directory e.t.c). Using short extent
        buff32[212 / 4] = 0x08;                        // Length of Allocation Descriptors
        buff32[216 / 4] = static_cast<uint32_t>(len);  // Allocation descriptors, data len in bytes
        buff32[220 / 4] = pos;  // Allocation descriptors, start logical block number inside volume
        calcDescriptorCRC(m_buffer, 224);
        m_file.write(m_buffer, SECTOR_SIZE);
        sectorsWrited++;
    }
    else if (extents == nullptr)
    {
        // file object. using long AD
        buff32[212 / 4] = 0x10;  // long AD size
        writeLongAD(m_buffer + 216, static_cast<uint32_t>(len), pos, 0, 0);
        calcDescriptorCRC(m_buffer, 232);
        m_file.write(m_buffer, SECTOR_SIZE);
        sectorsWrited++;
    }
    else
    {
        size_t indexEnd = FFMIN(MAX_EXTENTS_IN_EXTFILE, extents->size());
        if (extents->size() - indexEnd == 1)
            indexEnd++;  // continue record may be replaced by payload data
        buff32[212 / 4] = static_cast<uint32_t>(0x10 * indexEnd);
        uint8_t *curPos = m_buffer + 216;
        for (size_t i = 0; i < indexEnd; ++i)
        {
            writeLongAD(curPos, static_cast<uint32_t>(extents->at(i).size), extents->at(i).lbnPos, 0, 0);
            curPos += 16;
        }
        if (indexEnd < extents->size())
        {
            buff32[212 / 4] += 0x10;
            writeLongAD(curPos, SECTOR_SIZE + NEXT_EXTENT, absoluteSectorNum() + 1, 1, 0);  // continue expected
            curPos += 16;
        }
        calcDescriptorCRC(m_buffer, static_cast<uint16_t>(curPos - m_buffer));
        m_file.write(m_buffer, SECTOR_SIZE);
        sectorsWrited++;

        size_t indexStart = indexEnd;
        while (indexStart < extents->size())
        {
            indexEnd = FFMIN(indexStart + MAX_EXTENTS_IN_EXTCONT, extents->size());
            if (extents->size() - indexEnd == 1)
                indexEnd++;  // continue record may be replaced by payload data
            writeAllocationExtentDescriptor(extents, indexStart, indexEnd);
            sectorsWrited++;
            indexStart = indexEnd;
        }
    }

    return sectorsWrited;
}